

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

float * drwav_open_and_read_pcm_frames_f32
                  (drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData,uint *channelsOut,
                  uint *sampleRateOut,drwav_uint64 *totalFrameCountOut,
                  drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_bool32 dVar1;
  undefined4 *in_RCX;
  undefined4 *in_R8;
  undefined8 *in_R9;
  drwav wav;
  drwav_allocation_callbacks *in_stack_fffffffffffffe10;
  void *in_stack_fffffffffffffe18;
  drwav_seek_proc in_stack_fffffffffffffe20;
  drwav_read_proc in_stack_fffffffffffffe28;
  drwav *in_stack_fffffffffffffe30;
  drwav *in_stack_fffffffffffffe38;
  undefined8 local_8;
  
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0;
  }
  if (in_R9 != (undefined8 *)0x0) {
    *in_R9 = 0;
  }
  dVar1 = drwav_init(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                     in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  if (dVar1 == 0) {
    local_8 = (float *)0x0;
  }
  else {
    local_8 = drwav__read_pcm_frames_and_close_f32
                        (in_stack_fffffffffffffe38,(uint *)in_stack_fffffffffffffe30,
                         (uint *)in_stack_fffffffffffffe28,(drwav_uint64 *)in_stack_fffffffffffffe20
                        );
  }
  return local_8;
}

Assistant:

DRWAV_API float* drwav_open_and_read_pcm_frames_f32(drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, drwav_uint64* totalFrameCountOut, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    drwav wav;

    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }

    if (!drwav_init(&wav, onRead, onSeek, pUserData, pAllocationCallbacks)) {
        return NULL;
    }

    return drwav__read_pcm_frames_and_close_f32(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}